

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

bool __thiscall
ThreadedReplayer::derived_work_item_is_satisfied<ThreadedReplayer::DeferredGraphicsInfo>
          (ThreadedReplayer *this,DeferredGraphicsInfo *info,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines)

{
  int *piVar1;
  size_type sVar2;
  ulong uVar3;
  bool bVar4;
  key_type kStack_30;
  
  if (info->info == (VkGraphicsPipelineCreateInfo *)0x0) {
    return false;
  }
  for (piVar1 = (int *)info->info->pNext; piVar1 != (int *)0x0; piVar1 = *(int **)(piVar1 + 2)) {
    if (*piVar1 == 0x3b9f36d0) goto LAB_0014b801;
  }
  piVar1 = (int *)0x0;
LAB_0014b801:
  if (piVar1 == (int *)0x0) {
    return true;
  }
  bVar4 = piVar1[4] == 0;
  if (!bVar4) {
    kStack_30 = **(key_type **)(piVar1 + 6);
    sVar2 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&pipelines->_M_h,&kStack_30);
    if (sVar2 != 0) {
      uVar3 = 1;
      do {
        bVar4 = (uint)piVar1[4] <= uVar3;
        if (bVar4) {
          return bVar4;
        }
        kStack_30 = *(key_type *)(*(long *)(piVar1 + 6) + uVar3 * 8);
        sVar2 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&pipelines->_M_h,&kStack_30);
        uVar3 = uVar3 + 1;
      } while (sVar2 != 0);
    }
  }
  return bVar4;
}

Assistant:

bool derived_work_item_is_satisfied(const DerivedInfo &info,
	                                    const unordered_map<Hash, VkPipeline> &pipelines) const
	{
		if (!info.info)
			return false;
		auto *library = work_item_get_library_info(info);
		return !library || pipeline_library_info_is_satisfied(*library, pipelines);
	}